

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::lerp
          (LightNodeImpl<embree::SceneGraph::SpotLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  LightNode *pLVar1;
  long lVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  long *plVar28;
  _func_int **pp_Var29;
  long *in_RDX;
  long *plVar30;
  float fVar31;
  
  bVar3 = true;
  if (*in_RDX == 0) {
    plVar30 = (long *)0x0;
  }
  else {
    plVar28 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo,0);
    plVar30 = (long *)0x0;
    if (plVar28 != (long *)0x0) {
      (**(code **)(*plVar28 + 0x10))(plVar28);
      bVar3 = false;
      plVar30 = plVar28;
    }
  }
  pp_Var29 = (_func_int **)alignedMalloc(0xc0,0x10);
  fVar31 = 1.0 - f;
  fVar4 = *(float *)(plVar30 + 0x10);
  fVar5 = *(float *)((long)plVar30 + 0x84);
  fVar6 = *(float *)(plVar30 + 0x11);
  fVar7 = *(float *)((long)plVar30 + 0x8c);
  fVar8 = *(float *)&light1_in[0x10].ptr;
  fVar9 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar10 = *(float *)&light1_in[0x11].ptr;
  fVar11 = *(float *)((long)&light1_in[0x11].ptr + 4);
  fVar12 = *(float *)(plVar30 + 0x12);
  fVar13 = *(float *)((long)plVar30 + 0x94);
  fVar14 = *(float *)(plVar30 + 0x13);
  fVar15 = *(float *)((long)plVar30 + 0x9c);
  fVar16 = *(float *)&light1_in[0x12].ptr;
  fVar17 = *(float *)((long)&light1_in[0x12].ptr + 4);
  fVar18 = *(float *)&light1_in[0x13].ptr;
  fVar19 = *(float *)((long)&light1_in[0x13].ptr + 4);
  fVar20 = *(float *)(plVar30 + 0x14);
  fVar21 = *(float *)((long)plVar30 + 0xa4);
  fVar22 = *(float *)(plVar30 + 0x15);
  fVar23 = *(float *)((long)plVar30 + 0xac);
  fVar24 = *(float *)&light1_in[0x14].ptr;
  fVar25 = *(float *)((long)&light1_in[0x14].ptr + 4);
  fVar26 = *(float *)&light1_in[0x15].ptr;
  fVar27 = *(float *)((long)&light1_in[0x15].ptr + 4);
  pLVar1 = light1_in[0x16].ptr;
  lVar2 = plVar30[0x16];
  pp_Var29[1] = (_func_int *)0x0;
  pp_Var29[2] = (_func_int *)(pp_Var29 + 4);
  pp_Var29[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var29 + 4) = 0;
  pp_Var29[6] = (_func_int *)(pp_Var29 + 8);
  pp_Var29[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var29 + 8) = 0;
  pp_Var29[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var29 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var29 + 0x5c) = 0xffffffff;
  pp_Var29[0xc] = (_func_int *)0x0;
  *pp_Var29 = (_func_int *)&PTR__Node_002befe8;
  *(undefined4 *)(pp_Var29 + 0xe) = 3;
  *(float *)(pp_Var29 + 0x10) = fVar8 * fVar31 + fVar4 * f;
  *(float *)((long)pp_Var29 + 0x84) = fVar9 * fVar31 + fVar5 * f;
  *(float *)(pp_Var29 + 0x11) = fVar10 * fVar31 + fVar6 * f;
  *(float *)((long)pp_Var29 + 0x8c) = fVar11 * fVar31 + fVar7 * f;
  *(float *)(pp_Var29 + 0x12) = fVar16 * fVar31 + fVar12 * f;
  *(float *)((long)pp_Var29 + 0x94) = fVar17 * fVar31 + fVar13 * f;
  *(float *)(pp_Var29 + 0x13) = fVar18 * fVar31 + fVar14 * f;
  *(float *)((long)pp_Var29 + 0x9c) = fVar19 * fVar31 + fVar15 * f;
  *(float *)(pp_Var29 + 0x14) = fVar24 * fVar31 + fVar20 * f;
  *(float *)((long)pp_Var29 + 0xa4) = fVar25 * fVar31 + fVar21 * f;
  *(float *)(pp_Var29 + 0x15) = fVar26 * fVar31 + fVar22 * f;
  *(float *)((long)pp_Var29 + 0xac) = fVar27 * fVar31 + fVar23 * f;
  pp_Var29[0x16] =
       (_func_int *)
       CONCAT44((float)((ulong)pLVar1 >> 0x20) * fVar31 + (float)((ulong)lVar2 >> 0x20) * f,
                SUB84(pLVar1,0) * fVar31 + (float)lVar2 * f);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var29;
  LOCK();
  pp_Var29[1] = pp_Var29[1] + 1;
  UNLOCK();
  if (!bVar3) {
    (**(code **)(*plVar30 + 0x18))(plVar30);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }